

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  reference puVar5;
  size_type sVar6;
  iterator pvVar7;
  size_type sVar8;
  reference pvVar9;
  byte *pbVar10;
  reference pvVar11;
  const_reference pvVar12;
  ulong local_80;
  size_t j_1;
  size_t j;
  uint8_t byte;
  iterator __end3;
  iterator __begin3;
  array<unsigned_char,_4UL> *__range3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator it;
  array<unsigned_char,_4UL> local_20;
  int i;
  array<unsigned_char,_4UL> output_buffer;
  array<unsigned_char,_3UL> input_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *input_local;
  string *encoded;
  
  i._3_1_ = 0;
  _output_buffer = input;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  memset(&i,0,3);
  memset(&local_20,0,4);
  it._M_current._4_4_ = 0;
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(_output_buffer);
  while( true ) {
    local_38._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(_output_buffer);
    bVar4 = __gnu_cxx::
            operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      (&local_30,&local_38);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    __range3 = (array<unsigned_char,_4UL> *)
               __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator++(&local_30,0);
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&__range3);
    uVar1 = *puVar5;
    sVar8 = (size_type)it._M_current._4_4_;
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    pvVar9 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,sVar8);
    *pvVar9 = uVar1;
    sVar8 = (size_type)it._M_current._4_4_;
    sVar6 = std::array<unsigned_char,_3UL>::size((array<unsigned_char,_3UL> *)&i);
    if (sVar8 == sVar6) {
      pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,0);
      bVar2 = *pbVar10;
      pvVar11 = std::array<unsigned_char,_4UL>::operator[](&local_20,0);
      *pvVar11 = (value_type_conflict)((int)(bVar2 & 0xfc) >> 2);
      pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,0);
      bVar2 = *pbVar10;
      pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,1);
      bVar3 = *pbVar10;
      pvVar11 = std::array<unsigned_char,_4UL>::operator[](&local_20,1);
      *pvVar11 = (bVar2 & 3) * '\x10' + (char)((int)(bVar3 & 0xf0) >> 4);
      pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,1);
      bVar2 = *pbVar10;
      pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,2);
      bVar3 = *pbVar10;
      pvVar11 = std::array<unsigned_char,_4UL>::operator[](&local_20,2);
      *pvVar11 = (bVar2 & 0xf) * '\x04' + (char)((int)(bVar3 & 0xc0) >> 6);
      pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,2);
      bVar2 = *pbVar10;
      pbVar10 = std::array<unsigned_char,_4UL>::operator[](&local_20,3);
      *pbVar10 = bVar2 & 0x3f;
      __end3 = std::array<unsigned_char,_4UL>::begin(&local_20);
      pvVar7 = std::array<unsigned_char,_4UL>::end(&local_20);
      for (; __end3 != pvVar7; __end3 = __end3 + 1) {
        pvVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](&base64_chars_abi_cxx11_,(ulong)*__end3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,*pvVar12);
      }
      it._M_current._4_4_ = 0;
    }
  }
  if (it._M_current._4_4_ != 0) {
    for (j_1 = (size_t)it._M_current._4_4_;
        sVar8 = std::array<unsigned_char,_3UL>::size((array<unsigned_char,_3UL> *)&i), j_1 < sVar8;
        j_1 = j_1 + 1) {
      pvVar9 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,j_1);
      *pvVar9 = '\0';
    }
    pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,0);
    bVar2 = *pbVar10;
    pvVar11 = std::array<unsigned_char,_4UL>::operator[](&local_20,0);
    *pvVar11 = (value_type_conflict)((int)(bVar2 & 0xfc) >> 2);
    pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,0);
    bVar2 = *pbVar10;
    pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,1);
    bVar3 = *pbVar10;
    pvVar11 = std::array<unsigned_char,_4UL>::operator[](&local_20,1);
    *pvVar11 = (bVar2 & 3) * '\x10' + (char)((int)(bVar3 & 0xf0) >> 4);
    pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,1);
    bVar2 = *pbVar10;
    pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,2);
    bVar3 = *pbVar10;
    pvVar11 = std::array<unsigned_char,_4UL>::operator[](&local_20,2);
    *pvVar11 = (bVar2 & 0xf) * '\x04' + (char)((int)(bVar3 & 0xc0) >> 6);
    pbVar10 = std::array<unsigned_char,_3UL>::operator[]((array<unsigned_char,_3UL> *)&i,2);
    bVar2 = *pbVar10;
    pbVar10 = std::array<unsigned_char,_4UL>::operator[](&local_20,3);
    *pbVar10 = bVar2 & 0x3f;
    for (local_80 = 0; local_80 < (ulong)(long)(it._M_current._4_4_ + 1); local_80 = local_80 + 1) {
      pbVar10 = std::array<unsigned_char,_4UL>::operator[](&local_20,local_80);
      pvVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](&base64_chars_abi_cxx11_,(ulong)*pbVar10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,*pvVar12);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const std::vector<uint8_t>& input)
{
    std::string encoded;
    std::array<uint8_t, 3> input_buffer {};
    std::array<uint8_t, 4> output_buffer {};

    int i = 0;
    auto it = input.begin();
    while(it != input.end())
    {
        input_buffer[i++] = *(it++);
        if (i == input_buffer.size())
        {
            output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
            output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
            output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
            output_buffer[3] = input_buffer[2] & 0x3f;

            for(uint8_t byte : output_buffer)
                encoded += base64_chars[byte];
            i = 0;
        }
    }

    if (i)
    {
        for(size_t j=i ; j < input_buffer.size() ; ++j)
            input_buffer[j] = 0;

        output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
        output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
        output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
        output_buffer[3] = input_buffer[2] & 0x3f;

        for (size_t j=0 ; j<i+1 ; ++j)
            encoded += base64_chars[output_buffer[j]];
    }

    return encoded;
}